

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O3

double __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
compute_scalar_product
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                 *second)

{
  pointer ppVar1;
  undefined4 *puVar2;
  double dVar3;
  double dVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  int local_80;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  pair<double,_double> local_58;
  pair<double,_double> local_48;
  
  if (this->discrete == true) {
    pvVar5 = (this->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (this->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar15 = (long)pvVar6 - (long)pvVar5;
    pvVar7 = (second->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((lVar15 != (long)(second->heat_map).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) ||
         (this->min_ != second->min_)) || (NAN(this->min_) || NAN(second->min_))) ||
       ((this->max_ != second->max_ || (NAN(this->max_) || NAN(second->max_))))) {
LAB_00104ff1:
      std::operator<<((ostream *)&std::cerr,
                      "The persistence images are of non compatible sizes. We cannot therefore compute distance between them. The program will now terminate"
                     );
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = 
      "The persistence images are of non compatible sizes. The program will now terminate";
      __cxa_throw(puVar12,&char_const*::typeinfo,0);
    }
    if (pvVar6 != pvVar5) {
      dVar21 = 0.0;
      lVar16 = 0;
      do {
        pdVar8 = pvVar5[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar18 = (long)pvVar5[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar8;
        if (lVar18 != 0) {
          lVar19 = 0;
          do {
            dVar21 = dVar21 + pdVar8[lVar19] *
                              *(double *)
                               (*(long *)&pvVar7[lVar16].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + lVar19 * 8);
            lVar19 = lVar19 + 1;
          } while (lVar18 >> 3 != lVar19);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != (lVar15 >> 3) * -0x5555555555555555);
      return dVar21;
    }
  }
  else {
    uVar13 = (ulong)((long)(this->interval).
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->interval).
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    if (0 < (int)uVar13) {
      uVar17 = (ulong)((long)(second->interval).
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(second->interval).
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4;
      dVar21 = 0.0;
      uVar14 = 0;
      do {
        local_80 = (int)uVar17;
        if (0 < local_80) {
          ppVar1 = (this->interval).
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar14;
          dVar10 = ppVar1->first;
          dVar11 = ppVar1->second;
          lVar15 = 0;
          uVar20 = uVar17 & 0x7fffffff;
          do {
            dVar3 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14];
            dVar4 = *(double *)
                     ((long)(second->weights).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar15);
            puVar2 = (undefined4 *)
                     ((long)&((second->interval).
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first + lVar15 * 2);
            local_58.first._0_4_ = *puVar2;
            local_58.first._4_4_ = puVar2[1];
            local_58.second._0_4_ = puVar2[2];
            local_58.second._4_4_ = puVar2[3];
            local_68 = SUB84(dVar10,0);
            uStack_64 = (undefined4)((ulong)dVar10 >> 0x20);
            uStack_60 = SUB84(dVar11,0);
            uStack_5c = (undefined4)((ulong)dVar11 >> 0x20);
            local_48.first._0_4_ = local_68;
            local_48.first._4_4_ = uStack_64;
            local_48.second._0_4_ = uStack_60;
            local_48.second._4_4_ = uStack_5c;
            if ((this->kernel).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
              goto LAB_00104ff1;
            }
            dVar9 = (*(this->kernel)._M_invoker)((_Any_data *)&this->kernel,&local_48,&local_58);
            dVar21 = dVar21 + dVar9 * dVar3 * dVar4;
            lVar15 = lVar15 + 8;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        uVar14 = uVar14 + 1;
        if (uVar14 == (uVar13 & 0x7fffffff)) {
          return dVar21;
        }
      } while( true );
    }
  }
  return 0.0;
}

Assistant:

double Persistence_heat_maps<Scalling_of_kernels>::compute_scalar_product(const Persistence_heat_maps& second) const {
  if (discrete) {
    // first we need to check if (*this) and second are defined on the same domain and have the same dimensions:
    if (!this->check_if_the_same(second)) {
      std::cerr << "The persistence images are of non compatible sizes. We cannot therefore compute distance between "
                   "them. The program will now terminate";
      throw "The persistence images are of non compatible sizes. The program will now terminate";
    }

    // if we are here, we know that the two persistence images are defined on the same domain, so we can start computing
    // their scalar product:
    double scalar_prod = 0;
    for (size_t i = 0; i != this->heat_map.size(); ++i) {
      for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
        scalar_prod += this->heat_map[i][j] * second.heat_map[i][j];
      }
    }
    return scalar_prod;
  } else {
    int num_pts1 = this->interval.size();
    int num_pts2 = second.interval.size();
    double kernel_val = 0;
    for (int i = 0; i < num_pts1; i++) {
      std::pair<double, double> pi = this->interval[i];
      for (int j = 0; j < num_pts2; j++) {
        std::pair<double, double> pj = second.interval[j];
        kernel_val += this->weights[i] * second.weights[j] * this->kernel(pi, pj);
      }
    }
    return kernel_val;
  }
}